

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::fresnel::ior_to_f0(float_t ior,float_t *f0)

{
  float fVar1;
  float_t tmp;
  float_t *f0_local;
  float_t ior_local;
  
  if (ior <= 0.0) {
    __assert_fail("ior > 0 && \"Invalid ior\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x444,"void djb::fresnel::ior_to_f0(float_t, float_t *)");
  }
  if (f0 == (float_t *)0x0) {
    __assert_fail("f0 && \"Null output ptr\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x445,"void djb::fresnel::ior_to_f0(float_t, float_t *)");
  }
  fVar1 = (ior - 1.0) / (ior + 1.0);
  *f0 = fVar1 * fVar1;
  return;
}

Assistant:

void ior_to_f0(float_t ior, float_t *f0)
{
	DJB_ASSERT(ior > 0 && "Invalid ior");
	DJB_ASSERT(f0 && "Null output ptr");
	float_t tmp = (ior - 1) / (ior + 1);

	(*f0) = tmp * tmp;
}